

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

char * sha512_End(SHA512_CTX *context,char *buffer)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  sha2_byte digest [64];
  byte local_48 [64];
  
  if (buffer == (char *)0x0) {
    memzero(context,0xd0);
    pcVar4 = (char *)0x0;
  }
  else {
    sha512_Final(context,local_48);
    lVar2 = 0;
    lVar3 = 0;
    do {
      bVar1 = local_48[lVar3];
      buffer[lVar3 * 2] = "0123456789abcdef"[bVar1 >> 4];
      buffer[lVar3 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + -2;
    } while (lVar3 != 0x40);
    buffer[0x80] = '\0';
    pcVar4 = buffer + -lVar2;
  }
  memzero(local_48,0x40);
  return pcVar4;
}

Assistant:

char *sha512_End(trezor::SHA512_CTX* context, char buffer[]) {
	sha2_byte	digest[SHA512_DIGEST_LENGTH], *d = digest;
	int		i;

	if (buffer != (char*)0) {
		sha512_Final(context, digest);

		for (i = 0; i < SHA512_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		memzero(context, sizeof(trezor::SHA512_CTX));
	}
	memzero(digest, SHA512_DIGEST_LENGTH);
	return buffer;
}